

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

google_protobuf_ServiceDescriptorProto *
servicedef_toproto(upb_ToProto_Context *ctx,upb_ServiceDef *s)

{
  upb_Arena *a;
  undefined8 buf;
  _Bool _Var1;
  int iVar2;
  upb_DecodeStatus uVar3;
  google_protobuf_ServiceDescriptorProto *msg;
  char *s_00;
  void *pvVar4;
  upb_MethodDef *m;
  google_protobuf_MethodDescriptorProto *pgVar5;
  google_protobuf_ServiceOptions *msg_00;
  upb_Message *msg_01;
  size_t i;
  size_t sVar6;
  size_t size;
  upb_MiniTableField field;
  undefined4 uStack_34;
  
  msg = (google_protobuf_ServiceDescriptorProto *)
        _upb_Message_New(&google__protobuf__ServiceDescriptorProto_msg_init,ctx->arena);
  if (msg != (google_protobuf_ServiceDescriptorProto *)0x0) {
    s_00 = upb_ServiceDef_Name(s);
    _field = strviewdup(ctx,s_00);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_0036a760,&field);
    iVar2 = upb_ServiceDef_MethodCount(s);
    field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
    field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
    field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
    field.number_dont_copy_me__upb_internal_use_only = 2;
    field.offset_dont_copy_me__upb_internal_use_only = 0x20;
    field.presence = 0;
    pvVar4 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
    for (sVar6 = 0; (long)iVar2 != sVar6; sVar6 = sVar6 + 1) {
      m = upb_ServiceDef_Method(s,(int)sVar6);
      pgVar5 = methoddef_toproto(ctx,m);
      *(google_protobuf_MethodDescriptorProto **)((long)pvVar4 + sVar6 * 8) = pgVar5;
    }
    _Var1 = upb_ServiceDef_HasOptions(s);
    if (!_Var1) {
      return msg;
    }
    msg_00 = upb_ServiceDef_Options(s);
    upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__ServiceOptions_msg_init,0,ctx->arena,(char **)&field,&size);
    buf = field._0_8_;
    if (field._0_8_ != 0) {
      a = ctx->arena;
      msg_01 = _upb_Message_New(&google__protobuf__ServiceOptions_msg_init,a);
      if ((msg_01 != (upb_Message *)0x0) &&
         (uVar3 = upb_Decode((char *)buf,size,msg_01,&google__protobuf__ServiceOptions_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,a), uVar3 == kUpb_DecodeStatus_Ok)) {
        field._0_8_ = msg_01;
        upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_0036a778,&field);
        return msg;
      }
    }
  }
  siglongjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_ServiceDescriptorProto* servicedef_toproto(
    upb_ToProto_Context* ctx, const upb_ServiceDef* s) {
  google_protobuf_ServiceDescriptorProto* proto =
      google_protobuf_ServiceDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_ServiceDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_ServiceDef_Name(s)));

  size_t n = upb_ServiceDef_MethodCount(s);
  google_protobuf_MethodDescriptorProto** methods =
      google_protobuf_ServiceDescriptorProto_resize_method(proto, n, ctx->arena);
  for (size_t i = 0; i < n; i++) {
    methods[i] = methoddef_toproto(ctx, upb_ServiceDef_Method(s, i));
  }

  if (upb_ServiceDef_HasOptions(s)) {
    SET_OPTIONS(proto, ServiceDescriptorProto, ServiceOptions,
                upb_ServiceDef_Options(s));
  }

  return proto;
}